

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_24::BinaryReader::ReadTable
          (BinaryReader *this,Type *out_elem_type,Limits *out_elem_limits)

{
  Result RVar1;
  uint uVar2;
  char *format;
  uint32_t max;
  uint32_t initial;
  uint32_t flags;
  
  RVar1 = ReadType(this,out_elem_type,"table elem type");
  if (RVar1.enum_ == Error) {
    return (Result)Error;
  }
  uVar2 = out_elem_type->enum_ + ~(Func|I32U);
  if ((uVar2 < 0x1b) && ((0x40001c1U >> (uVar2 & 0x1f) & 1) != 0)) {
    max = 0;
    RVar1 = ReadU32Leb128(this,&flags,"table flags");
    if (RVar1.enum_ == Error) {
      return (Result)Error;
    }
    RVar1 = ReadU32Leb128(this,&initial,"table initial elem count");
    if (RVar1.enum_ == Error) {
      return (Result)Error;
    }
    if ((flags & 2) == 0) {
      uVar2 = 0;
      if (((flags & 1) != 0) &&
         (RVar1 = ReadU32Leb128(this,&max,"table max elem count"), uVar2 = max, RVar1.enum_ == Error
         )) {
        return (Result)Error;
      }
      out_elem_limits->has_max = SUB41(flags & 1,0);
      out_elem_limits->initial = (ulong)initial;
      out_elem_limits->max = (ulong)uVar2;
      return (Result)Ok;
    }
    format = "tables may not be shared";
  }
  else {
    format = "table elem type must be a reference type";
  }
  PrintError(this,format);
  return (Result)Error;
}

Assistant:

Result BinaryReader::ReadTable(Type* out_elem_type, Limits* out_elem_limits) {
  CHECK_RESULT(ReadType(out_elem_type, "table elem type"));
  ERROR_UNLESS(out_elem_type->IsRef(),
               "table elem type must be a reference type");

  uint32_t flags;
  uint32_t initial;
  uint32_t max = 0;
  CHECK_RESULT(ReadU32Leb128(&flags, "table flags"));
  CHECK_RESULT(ReadU32Leb128(&initial, "table initial elem count"));
  bool has_max = flags & WABT_BINARY_LIMITS_HAS_MAX_FLAG;
  bool is_shared = flags & WABT_BINARY_LIMITS_IS_SHARED_FLAG;
  ERROR_IF(is_shared, "tables may not be shared");
  if (has_max) {
    CHECK_RESULT(ReadU32Leb128(&max, "table max elem count"));
  }

  out_elem_limits->has_max = has_max;
  out_elem_limits->initial = initial;
  out_elem_limits->max = max;
  return Result::Ok;
}